

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.hpp
# Opt level: O0

int run<std::complex<double>,main::__1>
              (int nbQubits,int test,double *t_cpu,double *t_gpu,anon_class_1_0_00000001 *lambda,
              int IMAX_CPU,int IMAX_GPU)

{
  pointer __n;
  ostream *poVar1;
  reference this;
  double dVar2;
  double t;
  complex<double> local_d8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_c8;
  uint local_ac;
  undefined1 local_a8 [4];
  int i;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> psi;
  size_t N;
  int imax_gpu;
  int imax_cpu;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  time;
  undefined1 local_68 [8];
  QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> circuit;
  R tol;
  int IMAX_CPU_local;
  anon_class_1_0_00000001 *lambda_local;
  double *t_gpu_local;
  double *t_cpu_local;
  int test_local;
  int nbQubits_local;
  
  dVar2 = std::numeric_limits<double>::epsilon();
  circuit.gates_.
  super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(dVar2 * 10.0);
  qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::QCircuit
            ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)local_68,
             nbQubits);
  main::anon_class_1_0_00000001::operator()
            (lambda,(QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)
                    local_68);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&imax_gpu);
  *t_cpu = 9999.0;
  *t_gpu = 9999.0;
  psi.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(1L << ((byte)nbQubits & 0x3f));
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_a8);
  if ((test == 1) || (test == 3)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"CPU(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,nbQubits);
    poVar1 = std::operator<<(poVar1,")");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_ac = 0;
    N._4_4_ = IMAX_CPU;
    while (__n = psi.
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage, (int)local_ac < (int)N._4_4_) {
      std::complex<double>::complex(&local_d8,0.0,0.0);
      std::allocator<std::complex<double>_>::allocator
                ((allocator<std::complex<double>_> *)((long)&t + 7));
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                (&local_c8,(size_type)__n,&local_d8,
                 (allocator<std::complex<double>_> *)((long)&t + 7));
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_a8,
                 &local_c8);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector(&local_c8);
      std::allocator<std::complex<double>_>::~allocator
                ((allocator<std::complex<double>_> *)((long)&t + 7));
      this = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                       ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                        local_a8,0);
      std::complex<double>::operator=(this,1.0);
      tic((TP *)&imax_gpu);
      qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::simulate
                ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)local_68,
                 (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_a8);
      dVar2 = toc((TP *)&imax_gpu);
      if (dVar2 < *t_cpu) {
        *t_cpu = dVar2;
      }
      local_ac = local_ac + 1;
      if (local_ac == IMAX_CPU) {
        if (0.1 < *t_cpu || *t_cpu == 0.1) {
          if (*t_cpu <= 1.0 && *t_cpu != 1.0) {
            N._4_4_ = 10;
          }
        }
        else {
          N._4_4_ = 100;
        }
      }
      if ((((int)local_ac <= IMAX_CPU) || (local_ac == N._4_4_)) &&
         (printf("  * it%4i:%12.6fs",dVar2,(ulong)local_ac), local_ac != N._4_4_)) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
    }
    printf("  -->  min t_cpu = %.6fs\n",*t_cpu);
  }
  if ((*t_cpu == 9999.0) && (!NAN(*t_cpu))) {
    *t_cpu = 0.0;
  }
  if ((*t_gpu == 9999.0) && (!NAN(*t_gpu))) {
    *t_gpu = 0.0;
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_a8);
  qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::~QCircuit
            ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)local_68);
  return 0;
}

Assistant:

int run( const int nbQubits , const int test ,
         double& t_cpu , double& t_gpu , F& lambda ,
         const int IMAX_CPU = 3 , const int IMAX_GPU = 3 ) {

  using R = qclab::real_t< T > ;
  const R tol = 10 * std::numeric_limits< R >::epsilon() ;

  // quantum circuit
  qclab::QCircuit< T > circuit( nbQubits ) ;
  lambda( circuit ) ;

  // timing variable
  std::chrono::time_point< std::chrono::high_resolution_clock > time ;
  t_cpu = 9999 ;
  t_gpu = 9999 ;
  int imax_cpu = IMAX_CPU ;
  int imax_gpu = IMAX_GPU ;

  // vector size
  const size_t N = size_t(1) << nbQubits ;

  // simulate on CPU
  std::vector< T > psi ;
  if ( test == 1 || test == 3 ) {
    std::cout << "CPU(" << nbQubits << ")" << std::endl ;
    int i = 0 ;
    while ( i < imax_cpu ) {
      // all zero state
      psi = std::vector< T >( N , T(0) ) ;
      psi[0] = 1 ;
      // simulate
      tic( time ) ;
      circuit.simulate( psi ) ;
      auto t = toc( time ) ;
      if ( t < t_cpu ) t_cpu = t ;
      // increment
      ++i ;
      // update
      if ( i == IMAX_CPU ) {
        if ( t_cpu < 0.1 ) {
          imax_cpu = 100 ;
        } else if ( t_cpu < 1 ) {
          imax_cpu = 10 ;
        }
      }
      // output
      if ( i <= IMAX_CPU || i == imax_cpu ) {
        std::printf( "  * it%4i:%12.6fs" , i , t ) ;
        if ( i != imax_cpu ) std::cout << std::endl ;
      }
    }
    std::printf( "  -->  min t_cpu = %.6fs\n" , t_cpu ) ;
  }
  if ( t_cpu == 9999 ) { t_cpu = 0 ; }

  // simulate on GPU
  if ( test == 2 || test == 3 ) {
  #ifdef QCLAB_OMP_OFFLOADING
    std::cout << "GPU(" << nbQubits << ")" << std::endl ;
    std::vector< T > phi( N ) ; T* phi_ = phi.data() ;
    #pragma omp target enter data map(alloc:phi_[0:N])
    int i = 0 ;
    while ( i < imax_gpu ) {
      // all zero state
      #pragma omp target
      {
        phi_[0] = 1 ;
        #pragma omp parallel for
        for ( size_t i = 1; i < N; i++ ) {
          phi_[i] = 0 ;
        }
      }
      // simulate
      tic( time ) ;
      circuit.simulate_device( phi_ ) ;
      auto t = toc( time ) ;
      if ( t < t_gpu ) t_gpu = t ;
      // increment
      ++i ;
      // update
      if ( i == IMAX_GPU ) {
        if ( t_gpu < 0.1 ) {
          imax_gpu = 100 ;
        } else if ( t_gpu < 1 ) {
          imax_gpu = 10 ;
        }
      }
      // output
      if ( i <= IMAX_GPU || i == imax_gpu ) {
        std::printf( "  * it%4i:%12.6fs" , i , t ) ;
        if ( i != imax_gpu ) std::cout << std::endl ;
      }
    }
    std::printf( "  -->  min t_gpu = %.6fs" , t_gpu ) ;
    // check
    if ( test == 3 ) {
      std::printf( "  -->  speedup = %.2fx\n" , t_cpu / t_gpu ) ;
      #pragma omp target update from(phi_[0:N])
      for ( size_t i = 0; i < N; i++ ) {
        if ( std::abs( psi[i] - phi[i] ) > tol ) {
          std::cout << " *** CHECK FAILED! ***" << std::endl ;
          return -1 ;
        }
      }
      std::cout << "Check passed." << std::endl ;
    } else {
      std::cout << std::endl ;
    }
    #pragma omp target exit data map(delete:phi_[0:N])
  #endif
  }
  if ( t_gpu == 9999 ) { t_gpu = 0 ; }

  // successful
  return 0 ;

}